

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_custom_name.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  enable_if_t<Color,_optional<std::decay_t<Color>_>,_std::equal_to<void>_> eVar2;
  enable_if_t<Color,_string_view> eVar3;
  
  eVar3 = magic_enum::enum_name<Color,(magic_enum::detail::enum_subtype)0>(RED);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,eVar3._M_str,eVar3._M_len);
  std::endl<char,std::char_traits<char>>(poVar1);
  eVar3 = magic_enum::enum_name<Color,(magic_enum::detail::enum_subtype)0>(BLUE);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,eVar3._M_str,eVar3._M_len);
  std::endl<char,std::char_traits<char>>(poVar1);
  eVar3 = magic_enum::enum_name<Color,(magic_enum::detail::enum_subtype)0>(GREEN);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,eVar3._M_str,eVar3._M_len);
  std::endl<char,std::char_traits<char>>(poVar1);
  *(uint *)(std::ostream::_M_insert<bool> + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::_M_insert<bool> + *(long *)(std::cout + -0x18)) | 1;
  eVar2 = magic_enum::enum_cast<Color,(magic_enum::detail::enum_subtype)0,std::equal_to<void>>
                    (0xd,"the red color");
  if (((ulong)eVar2.super__Optional_base<Color,_true,_true>._M_payload.
              super__Optional_payload_base<Color> & 0x100000000) != 0) {
    poVar1 = std::ostream::_M_insert<bool>(true);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"the one",7);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Two",3);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Three",5);
    std::endl<char,std::char_traits<char>>(poVar1);
    return 0;
  }
  std::__throw_bad_optional_access();
}

Assistant:

int main() {
  std::cout << magic_enum::enum_name(Color::RED) << std::endl; // 'the red color'
  std::cout << magic_enum::enum_name(Color::BLUE) << std::endl; // 'The BLUE'
  std::cout << magic_enum::enum_name(Color::GREEN) << std::endl; // ''

  std::cout << std::boolalpha;
  std::cout << (magic_enum::enum_cast<Color>("the red color").value() == Color::RED) << std::endl; // true

  std::cout << magic_enum::enum_name(Numbers::One) << std::endl; // 'the one'
  std::cout << magic_enum::enum_name(Numbers::Two) << std::endl; // 'Two'
  std::cout << magic_enum::enum_name(Numbers::Three) << std::endl; // 'Three'

  return 0;
}